

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.h
# Opt level: O3

int msgpack_sbuffer_write(void *data,char *buf,size_t len)

{
  long lVar1;
  bool bVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  ulong __size;
  
  lVar4 = *data;
  lVar1 = *(long *)((long)data + 0x10);
  if ((ulong)(lVar1 - lVar4) < len) {
    uVar5 = 0x2000;
    if (lVar1 != 0) {
      uVar5 = lVar1 * 2;
    }
    do {
      __size = uVar5;
      if (lVar4 + len <= uVar5) break;
      bVar2 = 0 < (long)uVar5;
      __size = lVar4 + len;
      uVar5 = uVar5 * 2;
    } while (bVar2);
    pvVar3 = realloc(*(void **)((long)data + 8),__size);
    if (pvVar3 == (void *)0x0) {
      return -1;
    }
    *(void **)((long)data + 8) = pvVar3;
    *(ulong *)((long)data + 0x10) = __size;
    lVar4 = *data;
  }
  else {
    pvVar3 = *(void **)((long)data + 8);
  }
  memcpy((void *)(lVar4 + (long)pvVar3),buf,len);
  *(size_t *)data = *data + len;
  return 0;
}

Assistant:

static inline int msgpack_sbuffer_write(void* data, const char* buf, size_t len)
{
    msgpack_sbuffer* sbuf = (msgpack_sbuffer*)data;

    if(sbuf->alloc - sbuf->size < len) {
        void* tmp;
        size_t nsize = (sbuf->alloc) ?
                sbuf->alloc * 2 : MSGPACK_SBUFFER_INIT_SIZE;

        while(nsize < sbuf->size + len) {
            size_t tmp_nsize = nsize * 2;
            if (tmp_nsize <= nsize) {
                nsize = sbuf->size + len;
                break;
            }
            nsize = tmp_nsize;
        }

        tmp = realloc(sbuf->data, nsize);
        if(!tmp) { return -1; }

        sbuf->data = (char*)tmp;
        sbuf->alloc = nsize;
    }

    memcpy(sbuf->data + sbuf->size, buf, len);
    sbuf->size += len;
    return 0;
}